

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

void __thiscall
jsoncons::uri::uri(uri *this,string_view scheme,string_view userinfo,string_view host,
                  string_view port,string_view path,string_view query,string_view fragment)

{
  string_view port_00;
  error_code __ec;
  bool bVar1;
  undefined8 uVar2;
  allocator<char> *__a;
  const_pointer pvVar3;
  json_runtime_error<std::invalid_argument,_void> *this_00;
  const_reference pvVar4;
  string *in_RDI;
  string *in_stack_fffffffffffffeb8;
  json_runtime_error<std::invalid_argument,_void> *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  uri_errc __e;
  error_code *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  system_error *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string_view *in_stack_ffffffffffffff10;
  char local_59 [57];
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  __e = (uri_errc)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  std::__cxx11::string::string(in_RDI);
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)(in_RDI + 0x20));
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)(in_RDI + 0x30));
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)(in_RDI + 0x40));
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)(in_RDI + 0x50));
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)(in_RDI + 0x60));
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)(in_RDI + 0x70));
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)(in_RDI + 0x80));
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  if (!bVar1) {
    in_stack_ffffffffffffff08 = (string *)&stack0xfffffffffffffff0;
    in_stack_ffffffffffffff10 =
         (string_view *)
         std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff08);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff08);
    std::__cxx11::string::append((char *)in_RDI,(ulong)in_stack_ffffffffffffff10);
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x28) = uVar2;
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_20);
  if (((bVar1) &&
      (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                         ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008),
      bVar1)) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000018),
     bVar1)) {
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x38) = uVar2;
    *(undefined8 *)(in_RDI + 0x30) = uVar2;
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x48) = uVar2;
    *(undefined8 *)(in_RDI + 0x40) = uVar2;
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x58) = uVar2;
    *(undefined8 *)(in_RDI + 0x50) = uVar2;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0)
    ;
    if (!bVar1) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000028);
      if (((bVar1) &&
          (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                             ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000038),
          bVar1)) &&
         (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000048),
         bVar1)) {
        this_00 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                   (allocator<char> *)in_stack_fffffffffffffef0);
        json_runtime_error<std::invalid_argument,_void>::json_runtime_error
                  (this_00,in_stack_fffffffffffffeb8);
        __cxa_throw(this_00,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                    json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
      }
      std::__cxx11::string::append((char *)in_RDI);
    }
  }
  else {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0)
    ;
    if (!bVar1) {
      std::__cxx11::string::append((char *)in_RDI);
    }
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_20);
    if (bVar1) {
      uVar2 = std::__cxx11::string::length();
      *(undefined8 *)(in_RDI + 0x38) = uVar2;
      *(undefined8 *)(in_RDI + 0x30) = uVar2;
    }
    else {
      uVar2 = std::__cxx11::string::length();
      *(undefined8 *)(in_RDI + 0x30) = uVar2;
      encode_userinfo((string_view *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      uVar2 = std::__cxx11::string::length();
      *(undefined8 *)(in_RDI + 0x38) = uVar2;
      std::__cxx11::string::append((char *)in_RDI);
    }
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
    if (bVar1) {
      __a = (allocator<char> *)__cxa_allocate_exception(0x18);
      __s = local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff00,__s,__a);
      json_runtime_error<std::invalid_argument,_void>::json_runtime_error
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      __cxa_throw(__a,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                  json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
    }
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x40) = uVar2;
    in_stack_ffffffffffffff00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
    std::__cxx11::string::append((char *)in_RDI,(ulong)in_stack_ffffffffffffff00);
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x48) = uVar2;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000018);
    if (bVar1) {
      uVar2 = std::__cxx11::string::length();
      *(undefined8 *)(in_RDI + 0x58) = uVar2;
      *(undefined8 *)(in_RDI + 0x50) = uVar2;
    }
    else {
      port_00._M_len._7_1_ = in_stack_fffffffffffffeef;
      port_00._M_len._0_7_ = in_stack_fffffffffffffee8;
      port_00._M_str = (char *)in_stack_fffffffffffffef0;
      bVar1 = validate_port(port_00);
      if (!bVar1) {
        uVar2 = __cxa_allocate_exception(0x20);
        std::error_code::error_code<jsoncons::uri_errc,void>(in_stack_fffffffffffffed0,__e);
        __ec._M_cat = (error_category *)in_stack_ffffffffffffff00;
        __ec._0_8_ = in_stack_fffffffffffffef8;
        std::system_error::system_error(in_stack_fffffffffffffef0,__ec);
        __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      std::__cxx11::string::append((char *)in_RDI);
      uVar2 = std::__cxx11::string::length();
      *(undefined8 *)(in_RDI + 0x50) = uVar2;
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000018);
      std::basic_string_view<char,_std::char_traits<char>_>::size
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000018);
      std::__cxx11::string::append((char *)in_RDI,(ulong)pvVar3);
      uVar2 = std::__cxx11::string::length();
      *(undefined8 *)(in_RDI + 0x58) = uVar2;
    }
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000028);
  if (bVar1) {
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x68) = uVar2;
    *(undefined8 *)(in_RDI + 0x60) = uVar2;
  }
  else {
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x60) = uVar2;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
    if ((!bVar1) &&
       (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::front
                           ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000028),
       *pvVar4 != '/')) {
      std::__cxx11::string::push_back((char)in_RDI);
    }
    encode_path(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x68) = uVar2;
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000038);
  if (bVar1) {
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x78) = uVar2;
    *(undefined8 *)(in_RDI + 0x70) = uVar2;
  }
  else {
    std::__cxx11::string::append((char *)in_RDI);
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x70) = uVar2;
    encode_illegal_characters((string_view *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x78) = uVar2;
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000048);
  if (bVar1) {
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x88) = uVar2;
    *(undefined8 *)(in_RDI + 0x80) = uVar2;
  }
  else {
    std::__cxx11::string::append((char *)in_RDI);
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x80) = uVar2;
    encode_illegal_characters((string_view *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    uVar2 = std::__cxx11::string::length();
    *(undefined8 *)(in_RDI + 0x88) = uVar2;
  }
  return;
}

Assistant:

uri(jsoncons::string_view scheme,
            jsoncons::string_view userinfo,
            jsoncons::string_view host,
            jsoncons::string_view port,
            jsoncons::string_view path,
            jsoncons::string_view query = "",
            jsoncons::string_view fragment = "")
        {
            if (!scheme.empty()) 
            {
                uri_string_.append(scheme.data(), scheme.size());
                scheme_part_.second = uri_string_.length();
            }
            if (!userinfo.empty() || !host.empty() || !port.empty()) 
            {
                if (!scheme.empty()) 
                {
                    uri_string_.append("://");
                }

                if (!userinfo.empty()) 
                {
                    userinfo_part_.first = uri_string_.length();
                    encode_userinfo(userinfo, uri_string_);
                    userinfo_part_.second = uri_string_.length();
                    uri_string_.append("@");
                }
                else
                {
                    userinfo_part_.first = userinfo_part_.second = uri_string_.length();
                }

                if (!host.empty()) 
                {
                    host_part_.first = uri_string_.length();
                    uri_string_.append(host.data(), host.size());
                    host_part_.second = uri_string_.length();
                } 
                else 
                {
                    JSONCONS_THROW(json_runtime_error<std::invalid_argument>("uri error."));
                }

                if (!port.empty()) 
                {
                    if (!validate_port(port))
                    {
                        JSONCONS_THROW(std::system_error(uri_errc::invalid_port));
                    }

                    uri_string_.append(":");
                    port_part_.first = uri_string_.length();
                    uri_string_.append(port.data(), port.size());
                    port_part_.second = uri_string_.length();
                }
                else
                {
                    port_part_.first = port_part_.second = uri_string_.length();
                }
            }
            else 
            {
                userinfo_part_.first = userinfo_part_.second = uri_string_.length();
                host_part_.first = host_part_.second = uri_string_.length();
                port_part_.first = port_part_.second = uri_string_.length();
                if (!scheme.empty())
                {
                    if (!path.empty() || !query.empty() || !fragment.empty()) 
                    {
                        uri_string_.append(":");
                    } 
                    else 
                    {
                        JSONCONS_THROW(json_runtime_error<std::invalid_argument>("uri error."));
                    }
                }
            }

            if (!path.empty()) 
            {
                // if the URI is not opaque and the path is not already prefixed
                // with a '/', add one.
                path_part_.first = uri_string_.length();
                if (!host.empty() && (path.front() != '/')) 
                {
                    uri_string_.push_back('/');
                }
                encode_path(path, uri_string_);
                path_part_.second = uri_string_.length();
            }
            else
            {
                path_part_.first = path_part_.second = uri_string_.length();
            }

            if (!query.empty()) 
            {
                uri_string_.append("?");
                query_part_.first = uri_string_.length();
                encode_illegal_characters(query, uri_string_);
                query_part_.second = uri_string_.length();
            }
            else
            {
                query_part_.first = query_part_.second = uri_string_.length();
            }

            if (!fragment.empty()) 
            {
                uri_string_.append("#");
                fragment_part_.first = uri_string_.length();
                encode_illegal_characters(fragment, uri_string_);
                fragment_part_.second = uri_string_.length();
            }
            else
            {
                fragment_part_.first = fragment_part_.second = uri_string_.length();
            }
        }